

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void nivalis::anon_unknown_1::buf_add_screen_polyline
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,
               vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
               *points_screen,color *c,size_t rel_func,float thickness,bool closed,bool line,
               bool filled)

{
  float fVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *in_RDX;
  int *in_RSI;
  byte in_R9B;
  double dVar8;
  byte in_stack_00000008;
  byte in_stack_00000010;
  size_t i;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> points_conv;
  bool in_stack_000001d9;
  bool in_stack_000001da;
  bool in_stack_000001db;
  float in_stack_000001dc;
  size_t in_stack_000001e0;
  color *in_stack_000001e8;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *in_stack_000001f0;
  View *in_stack_000001f8;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *in_stack_00000200;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  size_type in_stack_ffffffffffffff78;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *in_stack_ffffffffffffff80;
  size_type sVar9;
  size_type local_60;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_48;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *local_18;
  int *local_10;
  
  local_2d = in_R9B & 1;
  local_2e = in_stack_00000008 & 1;
  local_2f = in_stack_00000010 & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x1818e5)
  ;
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size(local_18);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_60 = 0;
  while( true ) {
    sVar9 = local_60;
    sVar5 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size
                      (local_18);
    if (sVar5 <= sVar9) break;
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
              (local_18,local_60);
    pvVar6 = std::array<float,_2UL>::operator[]
                       ((array<float,_2UL> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    fVar1 = *pvVar6;
    iVar4 = *local_10;
    dVar8 = *(double *)(local_10 + 2);
    dVar2 = *(double *)(local_10 + 4);
    dVar3 = *(double *)(local_10 + 4);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_48,local_60);
    pvVar7 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *pvVar7 = (((double)fVar1 * 1.0) / (double)iVar4) * (dVar8 - dVar2) + dVar3;
    in_stack_ffffffffffffff74 = (float)local_10[1];
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
              (local_18,local_60);
    pvVar6 = std::array<float,_2UL>::operator[]
                       ((array<float,_2UL> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    dVar8 = (((double)(in_stack_ffffffffffffff74 - *pvVar6) * 1.0) / (double)local_10[1]) *
            (*(double *)(local_10 + 6) - *(double *)(local_10 + 8)) + *(double *)(local_10 + 8);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_48,local_60);
    pvVar7 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *pvVar7 = dVar8;
    local_60 = local_60 + 1;
  }
  buf_add_polyline(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                   in_stack_000001e0,in_stack_000001dc,in_stack_000001db,in_stack_000001da,
                   in_stack_000001d9);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void buf_add_screen_polyline(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        const std::vector<std::array<float, 2> >& points_screen,
        const color::color& c, size_t rel_func, float thickness = 1.,
        bool closed = false, bool line = true, bool filled = false) {
    std::vector<std::array<double, 2> > points_conv;
    points_conv.resize(points_screen.size());
    for (size_t i = 0; i < points_screen.size(); ++i) {
        points_conv[i][0] = points_screen[i][0]*1. / render_view.swid *
            (render_view.xmax - render_view.xmin) + render_view.xmin;
        points_conv[i][1] = (render_view.shigh - points_screen[i][1])*1. /
            render_view.shigh * (render_view.ymax - render_view.ymin) + render_view.ymin;
    }
    buf_add_polyline(draw_buf, render_view, points_conv, c, rel_func,
            thickness, closed, line, filled) ;
}